

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void auto_arima_summary(auto_arima_object obj)

{
  long lVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  double dVar14;
  
  iVar7 = obj->q;
  iVar11 = obj->p;
  iVar3 = obj->P;
  iVar4 = obj->M;
  iVar5 = obj->r;
  iVar6 = obj->Q;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    uVar8 = obj->retval;
    if (((ulong)uVar8 < 0x10) && ((0x9493U >> (uVar8 & 0x1f) & 1) != 0)) {
      printf((&PTR_anon_var_dwarf_b47_0015dd10)[uVar8]);
    }
  }
  iVar7 = iVar7 + iVar11 + iVar3 + iVar6 + iVar4;
  puts("\n");
  iVar11 = 0;
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,obj->Q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  if (0 < obj->p) {
    lVar13 = 0;
    do {
      dVar2 = obj->phi[lVar13];
      if (obj->vcov[iVar11] < 0.0) {
        sqrt(obj->vcov[iVar11]);
      }
      lVar1 = lVar13 + 1;
      printf("AR%-15d%-20g%-20g \n",dVar2,(ulong)((int)lVar13 + 1));
      iVar11 = iVar11 + iVar7 + 1;
      lVar13 = lVar1;
    } while (lVar1 < obj->p);
  }
  if (0 < obj->q) {
    lVar13 = 0;
    do {
      iVar11 = (int)lVar13;
      dVar2 = obj->theta[lVar13];
      if (obj->vcov[(obj->p + iVar11) * (iVar7 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + iVar11) * (iVar7 + 1)]);
      }
      lVar13 = lVar13 + 1;
      printf("MA%-15d%-20g%-20g \n",dVar2,(ulong)(iVar11 + 1));
    } while (lVar13 < obj->q);
  }
  if (0 < obj->P) {
    lVar13 = 0;
    do {
      iVar11 = (int)lVar13;
      dVar2 = obj->PHI[lVar13];
      if (obj->vcov[(obj->p + obj->q + iVar11) * (iVar7 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + iVar11) * (iVar7 + 1)]);
      }
      lVar13 = lVar13 + 1;
      printf("SAR%-14d%-20g%-20g \n",dVar2,(ulong)(iVar11 + 1));
    } while (lVar13 < obj->P);
  }
  if (0 < obj->Q) {
    lVar13 = 0;
    do {
      iVar11 = (int)lVar13;
      dVar2 = obj->THETA[lVar13];
      if (obj->vcov[(obj->p + obj->q + obj->P + iVar11) * (iVar7 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + obj->P + iVar11) * (iVar7 + 1)]);
      }
      lVar13 = lVar13 + 1;
      printf("SMA%-14d%-20g%-20g \n",dVar2,(ulong)(iVar11 + 1));
    } while (lVar13 < obj->Q);
  }
  putchar(10);
  iVar11 = obj->q + obj->p + obj->P + obj->Q;
  dVar2 = obj->mean;
  if (iVar5 < iVar4) {
    if (obj->vcov[(iVar7 + 1) * iVar11] < 0.0) {
      sqrt(obj->vcov[(iVar7 + 1) * iVar11]);
    }
    printf("%-17s%-20g%-20g \n",dVar2,"MEAN");
    iVar11 = iVar11 + 1;
  }
  else {
    printf("%-17s%-20g \n",dVar2,"MEAN");
  }
  if (obj->idrift == 1) {
    dVar2 = *obj->exog;
    dVar14 = obj->vcov[(iVar7 + 1) * iVar11];
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    printf("%-17s%-20g%-20g \n",dVar2,dVar14,"TREND");
    iVar11 = iVar11 + 1;
    uVar8 = 1;
  }
  else {
    printf("%-17s%-20g \n",0,"TREND");
    uVar8 = 0;
  }
  if ((int)uVar8 < obj->r) {
    uVar10 = (ulong)uVar8;
    iVar11 = iVar11 * (iVar7 + 1);
    do {
      dVar2 = obj->exog[uVar10];
      dVar14 = obj->vcov[iVar11];
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      printf("%-17s%-20g%-20g \n",dVar2,dVar14,"EXOG");
      uVar10 = uVar10 + 1;
      iVar11 = iVar11 + iVar7 + 1;
    } while ((int)uVar10 < obj->r);
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->sigma2,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_0015dd90 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if ((ulong)(uint)obj->optmethod < 8) {
    printf((&PTR_anon_var_dwarf_cc0_0015dda8)[(uint)obj->optmethod]);
  }
  puts("\n");
  printf("AIC criterion : %g ",obj->aic);
  puts("\n");
  printf("BIC criterion : %g ",obj->bic);
  puts("\n");
  printf("AICC criterion : %g ",obj->aicc);
  puts("\n");
  if ((uint)obj->method < 3) {
    printf("Log Likelihood : %g ",obj->loglik);
    puts("\n");
  }
  printf("Auto ARIMA Parameters ");
  puts("\n");
  pcVar12 = "FALSE";
  pcVar9 = "FALSE";
  if (obj->approximation == 1) {
    pcVar9 = "TRUE";
  }
  printf("Approximation: %s \n",pcVar9);
  if (obj->stepwise == 1) {
    pcVar12 = "TRUE";
  }
  printf("Stepwise: %s \n",pcVar12);
  return;
}

Assistant:

void auto_arima_summary(auto_arima_object obj) {
	int i, pq,t,ncxreg,mean,drift;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	mean = obj->M - obj->r;

	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->p,obj->d,obj->q,
	 obj->P,obj->D,obj->Q );
	printf("\n");
	t = 0;

	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
		t++;
		
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	ncxreg = 0;
	if (obj->idrift == 1) {
		printf("%-17s%-20g%-20g \n", "TREND", obj->exog[0], sqrt(obj->vcov[t + pq * t]));
		t++;
		ncxreg++;
	} else {
		printf("%-17s%-20g \n", "TREND", 0.0);
	}
	for(i = ncxreg; i < obj->r; ++i) {
		printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i], sqrt(obj->vcov[t + pq * t]));
		t++;
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->sigma2);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->method == 1) {
		printf("MLE");
	}
	else if (obj->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	
	printf("AIC criterion : %g ", obj->aic);
	printf("\n\n");
	printf("BIC criterion : %g ", obj->bic);
	printf("\n\n");
	printf("AICC criterion : %g ", obj->aicc);
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1 || obj->method == 2) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	printf("Auto ARIMA Parameters ");
	printf("\n\n");
	printf("Approximation: %s \n", obj->approximation == 1 ? "TRUE" : "FALSE");
	printf("Stepwise: %s \n", obj->stepwise == 1 ? "TRUE" : "FALSE");
}